

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate1.hpp
# Opt level: O0

void __thiscall
qclab::qgates::QRotationGate1<float>::QRotationGate1
          (QRotationGate1<float> *this,int qubit,rotation_type *rot,bool fixed)

{
  bool fixed_local;
  rotation_type *rot_local;
  int qubit_local;
  QRotationGate1<float> *this_local;
  
  QGate1<float>::QGate1(&this->super_QGate1<float>,qubit);
  QAdjustable::QAdjustable((QAdjustable *)&(this->super_QGate1<float>).field_0xc,fixed);
  (this->super_QGate1<float>).super_QObject<float>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00218518;
  (this->rotation_).angle_ = rot->angle_;
  return;
}

Assistant:

QRotationGate1( const int qubit , const rotation_type& rot ,
                        const bool fixed = false )
        : QGate1< T >( qubit )
        , rotation_( rot )
        , QAdjustable( fixed )
        { }